

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralConnection::IfcStructuralConnection
          (IfcStructuralConnection *this,void **vtt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  IfcStructuralItem::IfcStructuralItem((IfcStructuralItem *)this,vtt + 1);
  pp_Var1 = (_func_int **)vtt[0x1f];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>).
  _vptr_ObjectHelper = pp_Var1;
  *(void **)(pp_Var1[-3] +
            (long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>)
                   ._vptr_ObjectHelper) = vtt[0x20];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0x21];
  *(void **)&this->field_0x88 = vtt[0x22];
  *(void **)&this->field_0x98 = vtt[0x23];
  *(void **)&this->field_0xd0 = vtt[0x24];
  *(void **)&this->field_0x100 = vtt[0x25];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>).
  _vptr_ObjectHelper = (_func_int **)vtt[0x26];
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>).field_0x10 = 0
  ;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>).field_0x18 = 0;
  return;
}

Assistant:

IfcStructuralConnection() : Object("IfcStructuralConnection") {}